

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_ntop.c
# Opt level: O2

int sock_pton(char *cp,sockaddr *sa)

{
  addrinfo *paVar1;
  FILE *__stream;
  char cVar2;
  int __ecode;
  ushort **ppuVar3;
  char *__name;
  char *pcVar4;
  size_t __n;
  char *pcVar5;
  size_t sVar6;
  char *__service;
  addrinfo **__pai;
  addrinfo *servinfo;
  addrinfo local_68;
  
  if (sa == (sockaddr *)0x0 || cp == (char *)0x0) {
    return -1;
  }
  ppuVar3 = __ctype_b_loc();
  do {
    pcVar5 = cp;
    cp = pcVar5 + 1;
  } while ((*(byte *)((long)*ppuVar3 + (long)*pcVar5 * 2 + 1) & 0x20) != 0);
  if (*pcVar5 == '[') {
    cVar2 = '[';
    sVar6 = 0xffffffffffffffff;
    pcVar5 = cp;
    while( true ) {
      if (cVar2 == '\0') {
        return -2;
      }
      if (cVar2 == ']') break;
      cVar2 = *pcVar5;
      pcVar5 = pcVar5 + 1;
      sVar6 = sVar6 + 1;
    }
    __name = pcp_strndup(cp,sVar6);
  }
  else {
    __name = (char *)0x0;
    cp = pcVar5;
  }
  sVar6 = (long)pcVar5 - (long)cp;
  __service = (char *)0x0;
  do {
    cVar2 = *pcVar5;
    if (cVar2 == ':') {
      pcVar4 = pcVar5 + 1;
      if ((__service != (char *)0x0) && (pcVar4 = __service, __name == (char *)0x0)) break;
    }
    else {
      pcVar4 = __service;
      if (cVar2 == '\0') goto LAB_00106491;
    }
    sVar6 = sVar6 + 1;
    __service = pcVar4;
    pcVar5 = pcVar5 + 1;
  } while( true );
  __name = strdup(cp);
  __service = (char *)0x0;
LAB_00106491:
  if (__name == (char *)0x0) {
    if (__service != (char *)0x0 && cVar2 == '\0') {
      if ((long)__service - (long)cp < 2) {
        __name = (char *)0x0;
        goto LAB_001064ca;
      }
      sVar6 = ((long)__service - (long)cp) - 1;
    }
    __name = pcp_strndup(cp,sVar6);
  }
LAB_001064ca:
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_socktype = 2;
  local_68.ai_protocol = 0;
  local_68.ai_flags = 8;
  local_68.ai_family = 0;
  __pai = (addrinfo **)&servinfo;
  __ecode = getaddrinfo(__name,__service,&local_68,__pai);
  __stream = _stderr;
  if (__ecode != 0) {
    pcVar5 = gai_strerror(__ecode);
    fprintf(__stream,"getaddrinfo: %s\n",pcVar5);
    free(__name);
    return -2;
  }
  do {
    paVar1 = *__pai;
    if (paVar1 == (addrinfo *)0x0) {
LAB_0010653e:
      freeaddrinfo((addrinfo *)servinfo);
      free(__name);
      return 0;
    }
    if ((paVar1->ai_family | 8U) == 10) {
      __n = 0x10;
      if (paVar1->ai_addr->sa_family == 10) {
        __n = 0x1c;
      }
      memcpy(sa,paVar1->ai_addr,__n);
      if (__name == (char *)0x0) {
        if (paVar1->ai_family == 10) {
          sa[1].sa_data[2] = '\0';
          sa[1].sa_data[3] = '\0';
          sa[1].sa_data[4] = '\0';
          sa[1].sa_data[5] = '\0';
          sa[1].sa_data[6] = '\0';
          sa[1].sa_data[7] = '\0';
          sa[1].sa_data[8] = '\0';
          sa[1].sa_data[9] = '\0';
          *(undefined8 *)(sa[1].sa_data + 10) = 0;
          sa->sa_data[6] = '\0';
          sa->sa_data[7] = '\0';
          sa->sa_data[8] = '\0';
          sa->sa_data[9] = '\0';
          sa->sa_data[10] = '\0';
          sa->sa_data[0xb] = '\0';
          sa->sa_data[0xc] = '\0';
          sa->sa_data[0xd] = '\0';
          sa[1].sa_family = 0;
          sa[1].sa_data[0] = '\0';
          sa[1].sa_data[1] = '\0';
          sa[1].sa_data[2] = '\0';
          sa[1].sa_data[3] = '\0';
          sa[1].sa_data[4] = '\0';
          sa[1].sa_data[5] = '\0';
        }
        else {
          if (paVar1->ai_family != 2) {
            return -2;
          }
          sa->sa_data[2] = '\0';
          sa->sa_data[3] = '\0';
          sa->sa_data[4] = '\0';
          sa->sa_data[5] = '\0';
        }
      }
      goto LAB_0010653e;
    }
    __pai = &paVar1->ai_next;
  } while( true );
}

Assistant:

int sock_pton(const char *cp, struct sockaddr *sa) {
    const char *ip_end;
    char *host_name = NULL;
    const char *port = NULL;
    if ((!cp) || (!sa)) {
        return -1;
    }

    // skip ws
    while ((cp) && (isspace(*cp))) {
        ++cp;
    }

    ip_end = cp;
    if (*cp == '[') { // find matching bracket ']'
        ++cp;
        while ((*ip_end) && (*ip_end != ']')) {
            ++ip_end;
        }

        if (!*ip_end) {
            return -2;
        }
        host_name = strndup(cp, ip_end - cp);
        ++ip_end;
    }
    { // find start of port part
        while (*ip_end) {
            if (*ip_end == ':') {
                if (!port) {
                    port = ip_end + 1;
                } else if (host_name == NULL) { // means addr has [] block
                    port = NULL; // more than 1 ":" => assume the whole addr is
                                 // IPv6 address w/o port
                    host_name = strdup(cp);
                    break;
                }
            }
            ++ip_end;
        }
        if (!host_name) {
            if ((*ip_end == 0) && (port != NULL)) {
                if (port - cp > 1) { // only port entered
                    host_name = strndup(cp, port - cp - 1);
                }
            } else {
                host_name = strndup(cp, ip_end - cp);
            }
        }
    }

    // getaddrinfo for host
    {
        struct addrinfo hints, *servinfo, *p;
        int rv;

        memset(&hints, 0, sizeof hints);
        hints.ai_family = AF_UNSPEC;
        hints.ai_socktype = SOCK_DGRAM;
        hints.ai_flags = AI_V4MAPPED;

        if ((rv = getaddrinfo(host_name, port, &hints, &servinfo)) != 0) {
            fprintf(stderr, "getaddrinfo: %s\n", gai_strerror(rv));
            if (host_name)
                free(host_name);
            return -2;
        }

        for (p = servinfo; p != NULL; p = p->ai_next) {
            if ((p->ai_family == AF_INET) || (p->ai_family == AF_INET6)) {
                memcpy(sa, p->ai_addr, SA_LEN(p->ai_addr));
                if (host_name == NULL) { // getaddrinfo returns localhost ip if
                                         // hostname is null
                    switch (p->ai_family) {
                    case AF_INET:
                        ((struct sockaddr_in *)sa)->sin_addr.s_addr =
                            INADDR_ANY;
                        break;
                    case AF_INET6:
                        memset(&((struct sockaddr_in6 *)sa)->sin6_addr, 0,
                               sizeof(struct sockaddr_in6));
                        break;
                    default: // Should never happen LCOV_EXCL_START
                        if (host_name)
                            free(host_name);
                        return -2;
                    } // LCOV_EXCL_STOP
                }
                break;
            }
        }
        freeaddrinfo(servinfo);
    }

    if (host_name)
        free(host_name);
    return 0;
}